

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O1

void stl(double *x,int N,int f,char *s_window_type,int *s_window,int *s_degree,int *t_window,
        int *t_degree,int *l_window,int *l_degree,int *s_jump,int *t_jump,int *l_jump,int *robust,
        int *inner,int *outer,double *seasonal,double *trend,double *remainder)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double *rw;
  double *work;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  char *__s;
  uint uVar9;
  uint uVar10;
  size_t __nmemb;
  bool bVar11;
  double dVar12;
  uint local_7c;
  int local_78;
  int l_window_;
  int s_jump_;
  int t_jump_;
  int l_jump_;
  int inner_;
  int outer_;
  undefined4 uStack_5c;
  int local_54;
  uint local_50;
  int f_local;
  int t_window_;
  int l_degree_;
  int local_40;
  int local_3c;
  int N_local;
  int s_degree_;
  int t_degree_;
  int s_window_;
  
  local_54 = f;
  local_40 = N;
  if ((f < 2) || (N < f * 2)) {
    __s = "Series is not periodic or has less than two periods. ";
  }
  else {
    _t_window_ = (double *)CONCAT44(in_register_00000034,N);
    iVar4 = strcmp(s_window_type,"period");
    if (iVar4 == 0) {
      s_degree_ = (int)_t_window_ * 10 + 1;
      local_3c = 0;
    }
    else {
      if (s_window == (int *)0x0) {
        __s = "Error. Either set s_window_type to period or assign an integer value to s_window ";
        goto LAB_0014b937;
      }
      s_degree_ = *s_window;
    }
    if (t_window == (int *)0x0) {
      dVar12 = ceil(((double)f * 1.5) / (1.0 - 1.5 / (double)s_degree_));
      local_50 = (int)dVar12 | 1;
    }
    if (s_degree == (int *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = *s_degree;
    }
    _outer_ = (double *)CONCAT44(uStack_5c,local_3c);
    if (t_degree == (int *)0x0) {
      uVar10 = 1;
    }
    else {
      uVar10 = *t_degree;
    }
    N_local = uVar10;
    if (l_window == (int *)0x0) {
      uVar9 = f | 1;
    }
    else {
      uVar9 = *l_window;
    }
    if (l_degree == (int *)0x0) {
      l_degree = &N_local;
    }
    uVar2 = *l_degree;
    local_7c = uVar9;
    inner_ = iVar4;
    f_local = uVar2;
    if (s_jump == (int *)0x0) {
      dVar12 = ceil((double)s_degree_ / 10.0);
    }
    else {
      dVar12 = (double)*s_jump;
    }
    local_78 = (int)dVar12;
    if (t_jump == (int *)0x0) {
      dVar12 = ceil((double)(int)local_50 / 10.0);
    }
    else {
      dVar12 = (double)*t_jump;
    }
    l_window_ = (int)dVar12;
    if (l_jump == (int *)0x0) {
      dVar12 = ceil((double)(int)uVar9 / 10.0);
    }
    else {
      dVar12 = (double)*l_jump;
    }
    s_jump_ = (int)dVar12;
    if (robust == (int *)0x0) {
      bVar11 = true;
    }
    else {
      bVar11 = *robust == 0;
    }
    if (inner == (int *)0x0) {
      t_jump_ = bVar11 + 1;
      l_jump_ = 0xf;
      if (bVar11 != false) {
        l_jump_ = 0;
      }
    }
    else {
      t_jump_ = *inner;
      l_jump_ = *outer;
    }
    if ((((uint)outer_ < 2) && (local_3c = outer_, uVar10 < 2)) && (N_local = uVar10, uVar2 < 2)) {
      iVar4 = (int)_t_window_;
      f_local = uVar2;
      rw = (double *)calloc((long)iVar4,8);
      work = (double *)calloc((long)((f * 2 + iVar4) * 5),8);
      __ptr = calloc((long)iVar4,4);
      _outer_ = work;
      _t_window_ = rw;
      stl_(x,&local_40,&local_54,&s_degree_,(int *)&local_50,(int *)&local_7c,&local_3c,&N_local,
           &f_local,&local_78,&l_window_,&s_jump_,&t_jump_,&l_jump_,rw,seasonal,trend,work);
      iVar3 = local_40;
      iVar4 = local_54;
      if (inner_ == 0) {
        uVar8 = (ulong)local_40;
        __nmemb = (size_t)local_54;
        if (0 < (long)uVar8) {
          uVar6 = 0;
          do {
            *(int *)((long)__ptr + uVar6 * 4) =
                 (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                      (long)local_54);
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        __ptr_00 = calloc(__nmemb,__nmemb * 8);
        __ptr_01 = calloc(__nmemb,__nmemb * 4);
        if (0 < iVar3) {
          uVar6 = 0;
          do {
            lVar7 = (long)*(int *)((long)__ptr + uVar6 * 4);
            piVar1 = (int *)((long)__ptr_01 + lVar7 * 4);
            *piVar1 = *piVar1 + 1;
            *(double *)((long)__ptr_00 + lVar7 * 8) =
                 seasonal[uVar6] + *(double *)((long)__ptr_00 + lVar7 * 8);
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        if (0 < iVar4) {
          sVar5 = 0;
          do {
            *(double *)((long)__ptr_00 + sVar5 * 8) =
                 *(double *)((long)__ptr_00 + sVar5 * 8) /
                 (double)*(int *)((long)__ptr_01 + sVar5 * 4);
            sVar5 = sVar5 + 1;
          } while (__nmemb != sVar5);
        }
        if (0 < iVar3) {
          uVar6 = 0;
          do {
            seasonal[uVar6] =
                 *(double *)((long)__ptr_00 + (long)*(int *)((long)__ptr + uVar6 * 4) * 8);
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        free(__ptr_00);
        free(__ptr_01);
      }
      if (0 < (long)local_40) {
        lVar7 = 0;
        do {
          remainder[lVar7] = (x[lVar7] - seasonal[lVar7]) - trend[lVar7];
          lVar7 = lVar7 + 1;
        } while (local_40 != lVar7);
      }
      free(_t_window_);
      free(_outer_);
      free(__ptr);
      return;
    }
    __s = "Degree must be either 0 or 1 ";
  }
LAB_0014b937:
  puts(__s);
  exit(-1);
}

Assistant:

void stl(double *x,int N,int f, const char *s_window_type,int *s_window, int *s_degree, int *t_window, int *t_degree,int *l_window,int *l_degree,
    int *s_jump, int *t_jump, int *l_jump, int *robust,int *inner, int *outer,double *seasonal,double *trend, double *remainder) {
    
    double *rw,*work;
    int *seas_cycle;
    int i;
    int s_window_,s_degree_,t_window_,t_degree_,l_window_,l_degree_,s_jump_,t_jump_,l_jump_,inner_,outer_,periodic_,robust_;

    if (f < 2 || N < 2*f) {
        printf("Series is not periodic or has less than two periods. \n");
        exit(-1);
    }

    //Default Values

    periodic_ = 0;

    if (!strcmp(s_window_type,"period")) {
        periodic_ = 1;
        s_window_ = 10 * N + 1;
        s_degree_ = 0;
    } else {
        if (s_window == NULL) {
            printf("Error. Either set s_window_type to period or assign an integer value to s_window \n");
            exit(-1);
        } else {
            s_window_ = *s_window;
        }
    }

    if (t_window == NULL) {
        t_window_ = nextOdd(ceil( 1.5 * f / (1.0 - 1.5 / (double) s_window_)));
    }

    s_degree_ = (s_degree == NULL) ? 0 : *s_degree;

    //if (t_window == NULL) *t_window = 0;
    t_degree_ = (t_degree == NULL) ? 1 : *t_degree;
    l_window_ = (l_window == NULL) ? nextOdd(f) : *l_window;
    l_degree_ = (l_degree == NULL) ? t_degree_ : *l_degree;
    s_jump_ = (s_jump == NULL) ? ceil((double)s_window_ / 10.0) : *s_jump;
    t_jump_ = (t_jump == NULL) ? ceil((double)t_window_ / 10.0) : *t_jump;
    l_jump_ = (l_jump == NULL) ? ceil((double)l_window_ / 10.0) : *l_jump;

    robust_ = (robust == NULL) ? 0 : *robust;
    inner_ = (inner == NULL) ? (robust_ ? 1 : 2) : *inner;
    outer_ = (inner == NULL) ? (robust_ ? 15 : 0) : *outer;

    
    s_degree_ = degCheck(s_degree_);
    t_degree_ = degCheck(t_degree_);
    l_degree_ = degCheck(l_degree_);

    

    // Initialize work vectors

    rw = (double*)calloc(N,sizeof(double));
    work = (double*)calloc((N+2*f)*5,sizeof(double));
    seas_cycle = (int*)calloc(N,sizeof(int));


    stl_(x,&N,&f,&s_window_,&t_window_,&l_window_,&s_degree_,&t_degree_,&l_degree_,&s_jump_,&t_jump_,&l_jump_,&inner_,&outer_,rw,seasonal,trend,work);
	

    if (periodic_) {
        cycle(N,f,seas_cycle);
        applySeasonalMean(seasonal,N,seas_cycle,f);
    }

    for (i = 0; i < N;++i) {
        remainder[i] = x[i] - seasonal[i] - trend[i];
    }

    free(rw);
    free(work);
    free(seas_cycle);
}